

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

string * pstore::file::file_handle::get_temporary_directory_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  long lVar1;
  
  lVar1 = 0;
  do {
    __s = getenv(*(char **)((long)get_temporary_directory::env_var_names._M_elems + lVar1));
    if (__s != (char *)0x0) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      strlen(__s);
      goto LAB_0013c27d;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
LAB_0013c27d:
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string file_handle::get_temporary_directory () {
            // Following boost filesystem, we check some select environment variables
            // for user temporary directories before resorting to /tmp.
            static constexpr std::array<gsl::czstring, 4> env_var_names{{
                "TMPDIR",
                "TMP",
                "TEMP",
                "TEMPDIR",
            }};
            for (gsl::czstring const name : env_var_names) {
                if (gsl::czstring const val = std::getenv (name)) {
                    return val;
                }
            }
            return "/tmp";
        }